

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsa_StrDup(PaAlsaHostApiRepresentation *alsaApi,char **dst,char *src)

{
  size_t sVar1;
  void *pvVar2;
  char *in_RDX;
  PaUtilAllocationGroup *in_RSI;
  int len;
  PaError result;
  PaError local_1c;
  
  local_1c = 0;
  sVar1 = strlen(in_RDX);
  pvVar2 = PaUtil_GroupAllocateMemory(in_RSI,(long)in_RDX);
  in_RSI->linkCount = (long)pvVar2;
  if (pvVar2 == (void *)0x0) {
    PaUtil_DebugPrint(
                     "Expression \'*dst = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1055\n"
                     );
    local_1c = -0x2708;
  }
  else {
    strncpy((char *)in_RSI->linkCount,in_RDX,(long)((int)sVar1 + 1));
  }
  return local_1c;
}

Assistant:

static PaError PaAlsa_StrDup( PaAlsaHostApiRepresentation *alsaApi,
        char **dst,
        const char *src)
{
    PaError result = paNoError;
    int len = strlen( src ) + 1;

    /* PA_DEBUG(("PaStrDup %s %d\n", src, len)); */

    PA_UNLESS( *dst = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len ),
            paInsufficientMemory );
    strncpy( *dst, src, len );

error:
    return result;
}